

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::BeginTabBarEx(ImGuiTabBar *tab_bar,ImRect *tab_bar_bb,ImGuiTabBarFlags flags)

{
  ImDrawList *this;
  ImGuiWindow *pIVar1;
  ImGuiCol idx;
  ImGuiPtrOrIndex IVar2;
  ImVec2 local_88;
  ImVec2 local_80;
  float local_78;
  float local_74;
  float separator_max_x;
  float separator_min_x;
  float y;
  ImU32 col;
  ImVec2 local_60;
  void *local_58;
  int local_50;
  ImGuiPtrOrIndex local_48;
  ImGuiWindow *local_38;
  ImGuiWindow *window;
  ImGuiContext *g;
  ImRect *pIStack_20;
  ImGuiTabBarFlags flags_local;
  ImRect *tab_bar_bb_local;
  ImGuiTabBar *tab_bar_local;
  
  window = (ImGuiWindow *)GImGui;
  local_38 = GImGui->CurrentWindow;
  if ((local_38->SkipItems & 1U) == 0) {
    g._4_4_ = (float)flags;
    pIStack_20 = tab_bar_bb;
    tab_bar_bb_local = (ImRect *)tab_bar;
    if ((flags & 0x100000U) == 0) {
      PushOverrideID(tab_bar->ID);
    }
    pIVar1 = window + 0x12;
    IVar2 = GetTabBarRefFromTabBar((ImGuiTabBar *)tab_bar_bb_local);
    local_58 = IVar2.Ptr;
    local_50 = IVar2.Index;
    local_48.Ptr = local_58;
    local_48.Index = local_50;
    ImVector<ImGuiPtrOrIndex>::push_back((ImVector<ImGuiPtrOrIndex> *)&pIVar1->Size,&local_48);
    *(ImRect **)&window[0x11].MemoryDrawListIdxCapacity = tab_bar_bb_local;
    tab_bar_bb_local[8].Min = (local_38->DC).CursorPos;
    if (tab_bar_bb_local[2].Min.y == window[0x10].ClipRect.Max.x) {
      ImVec2::ImVec2(&local_60,tab_bar_bb_local[2].Max.y,
                     tab_bar_bb_local[3].Max.x + tab_bar_bb_local[7].Min.y);
      (local_38->DC).CursorPos = local_60;
      *(char *)((long)&tab_bar_bb_local[6].Max.x + 2) =
           *(char *)((long)&tab_bar_bb_local[6].Max.x + 2) + '\x01';
      tab_bar_local._7_1_ = true;
    }
    else {
      if ((((uint)g._4_4_ & 1) != ((uint)tab_bar_bb_local[1].Min.x & 1)) ||
         ((((uint)tab_bar_bb_local[6].Max.y & 0x100) != 0 && (((uint)g._4_4_ & 1) == 0)))) {
        ImQsort((void *)tab_bar_bb_local->Max,(long)(int)(tab_bar_bb_local->Min).x,0x2c,
                TabItemComparerByBeginOrder);
      }
      *(undefined1 *)((long)&tab_bar_bb_local[6].Max.y + 1) = 0;
      if (((uint)g._4_4_ & 0xc0) == 0) {
        g._4_4_ = (float)((uint)g._4_4_ | 0x40);
      }
      tab_bar_bb_local[1].Min.x = g._4_4_;
      *(ImVec2 *)&tab_bar_bb_local[2].Max.y = pIStack_20->Min;
      *(ImVec2 *)&tab_bar_bb_local[3].Min.y = pIStack_20->Max;
      *(undefined1 *)((long)&tab_bar_bb_local[6].Max.x + 3) = 1;
      tab_bar_bb_local[2].Max.x = tab_bar_bb_local[2].Min.y;
      tab_bar_bb_local[2].Min.y = window[0x10].ClipRect.Max.x;
      tab_bar_bb_local[4].Min.x = tab_bar_bb_local[3].Max.y;
      tab_bar_bb_local[3].Max.y = 0.0;
      tab_bar_bb_local[7].Min.y = (float)window[0xf].ID;
      tab_bar_bb_local[7].Max = *(ImVec2 *)&window[0xe].MemoryDrawListVtxCapacity;
      *(undefined2 *)((long)&tab_bar_bb_local[6].Max.y + 2) = 0;
      *(undefined1 *)((long)&tab_bar_bb_local[6].Max.x + 2) = 1;
      ImVec2::ImVec2((ImVec2 *)&y,tab_bar_bb_local[2].Max.y,
                     tab_bar_bb_local[3].Max.x + tab_bar_bb_local[7].Min.y);
      (local_38->DC).CursorPos = _y;
      idx = 0x25;
      if (((uint)g._4_4_ & 0x200000) != 0) {
        idx = 0x23;
      }
      separator_min_x = (float)GetColorU32(idx,1.0);
      separator_max_x = tab_bar_bb_local[3].Max.x - 1.0;
      local_74 = tab_bar_bb_local[2].Max.y - (float)(int)((local_38->WindowPadding).x * 0.5);
      local_78 = tab_bar_bb_local[3].Min.y + (float)(int)((local_38->WindowPadding).x * 0.5);
      this = local_38->DrawList;
      ImVec2::ImVec2(&local_80,local_74,separator_max_x);
      ImVec2::ImVec2(&local_88,local_78,separator_max_x);
      ImDrawList::AddLine(this,&local_80,&local_88,(ImU32)separator_min_x,1.0);
      tab_bar_local._7_1_ = true;
    }
  }
  else {
    tab_bar_local._7_1_ = false;
  }
  return tab_bar_local._7_1_;
}

Assistant:

bool    ImGui::BeginTabBarEx(ImGuiTabBar* tab_bar, const ImRect& tab_bar_bb, ImGuiTabBarFlags flags)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    if (window->SkipItems)
        return false;

    if ((flags & ImGuiTabBarFlags_DockNode) == 0)
        PushOverrideID(tab_bar->ID);

    // Add to stack
    g.CurrentTabBarStack.push_back(GetTabBarRefFromTabBar(tab_bar));
    g.CurrentTabBar = tab_bar;

    // Append with multiple BeginTabBar()/EndTabBar() pairs.
    tab_bar->BackupCursorPos = window->DC.CursorPos;
    if (tab_bar->CurrFrameVisible == g.FrameCount)
    {
        window->DC.CursorPos = ImVec2(tab_bar->BarRect.Min.x, tab_bar->BarRect.Max.y + tab_bar->ItemSpacingY);
        tab_bar->BeginCount++;
        return true;
    }

    // Ensure correct ordering when toggling ImGuiTabBarFlags_Reorderable flag, or when a new tab was added while being not reorderable
    if ((flags & ImGuiTabBarFlags_Reorderable) != (tab_bar->Flags & ImGuiTabBarFlags_Reorderable) || (tab_bar->TabsAddedNew && !(flags & ImGuiTabBarFlags_Reorderable)))
        ImQsort(tab_bar->Tabs.Data, tab_bar->Tabs.Size, sizeof(ImGuiTabItem), TabItemComparerByBeginOrder);
    tab_bar->TabsAddedNew = false;

    // Flags
    if ((flags & ImGuiTabBarFlags_FittingPolicyMask_) == 0)
        flags |= ImGuiTabBarFlags_FittingPolicyDefault_;

    tab_bar->Flags = flags;
    tab_bar->BarRect = tab_bar_bb;
    tab_bar->WantLayout = true; // Layout will be done on the first call to ItemTab()
    tab_bar->PrevFrameVisible = tab_bar->CurrFrameVisible;
    tab_bar->CurrFrameVisible = g.FrameCount;
    tab_bar->PrevTabsContentsHeight = tab_bar->CurrTabsContentsHeight;
    tab_bar->CurrTabsContentsHeight = 0.0f;
    tab_bar->ItemSpacingY = g.Style.ItemSpacing.y;
    tab_bar->FramePadding = g.Style.FramePadding;
    tab_bar->TabsActiveCount = 0;
    tab_bar->BeginCount = 1;

    // Set cursor pos in a way which only be used in the off-chance the user erroneously submits item before BeginTabItem(): items will overlap
    window->DC.CursorPos = ImVec2(tab_bar->BarRect.Min.x, tab_bar->BarRect.Max.y + tab_bar->ItemSpacingY);

    // Draw separator
    const ImU32 col = GetColorU32((flags & ImGuiTabBarFlags_IsFocused) ? ImGuiCol_TabActive : ImGuiCol_TabUnfocusedActive);
    const float y = tab_bar->BarRect.Max.y - 1.0f;
    {
        const float separator_min_x = tab_bar->BarRect.Min.x - IM_FLOOR(window->WindowPadding.x * 0.5f);
        const float separator_max_x = tab_bar->BarRect.Max.x + IM_FLOOR(window->WindowPadding.x * 0.5f);
        window->DrawList->AddLine(ImVec2(separator_min_x, y), ImVec2(separator_max_x, y), col, 1.0f);
    }
    return true;
}